

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

int nexttoken(char **in,time_t *value)

{
  char *pcVar1;
  ushort *puVar2;
  byte *pbVar3;
  int iVar4;
  ushort **ppuVar5;
  size_t sVar6;
  bool bVar7;
  ulong local_90;
  size_t abbrev;
  LEXICON *pLStack_80;
  uint i;
  LEXICON *tp;
  char *src;
  char local_68 [4];
  int Count;
  char buff [64];
  char c;
  time_t *value_local;
  char **in_local;
  
  while( true ) {
    while (ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)(byte)**in] & 0x2000) != 0) {
      *in = *in + 1;
    }
    if (**in != '(') break;
    src._4_4_ = 0;
    do {
      pcVar1 = *in;
      *in = pcVar1 + 1;
      buff[0x3f] = *pcVar1;
      if (buff[0x3f] == '\0') {
        return 0;
      }
      if (buff[0x3f] == '(') {
        src._4_4_ = src._4_4_ + 1;
      }
      else if (buff[0x3f] == ')') {
        src._4_4_ = src._4_4_ + -1;
      }
    } while (0 < src._4_4_);
  }
  tp = (LEXICON *)*in;
  abbrev._4_4_ = 0;
  while( true ) {
    bVar7 = false;
    if (((char)tp->abbrev != '\0') &&
       ((ppuVar5 = __ctype_b_loc(), ((*ppuVar5)[(int)(uint)(byte)tp->abbrev] & 8) != 0 ||
        (bVar7 = false, (char)tp->abbrev == '.')))) {
      bVar7 = abbrev._4_4_ < 0x3f;
    }
    if (!bVar7) break;
    if ((char)tp->abbrev != '.') {
      ppuVar5 = __ctype_b_loc();
      if (((*ppuVar5)[(int)(uint)(byte)tp->abbrev] & 0x100) == 0) {
        local_68[abbrev._4_4_] = (char)tp->abbrev;
      }
      else {
        iVar4 = tolower((uint)(byte)tp->abbrev);
        local_68[abbrev._4_4_] = (char)iVar4;
      }
      abbrev._4_4_ = abbrev._4_4_ + 1;
    }
    tp = (LEXICON *)((long)&tp->abbrev + 1);
  }
  local_68[abbrev._4_4_] = '\0';
  pLStack_80 = TimeWords;
  do {
    if (pLStack_80->name == (char *)0x0) {
      ppuVar5 = __ctype_b_loc();
      buff[0x3f] = **in;
      if (((*ppuVar5)[(int)(uint)(byte)buff[0x3f]] & 0x800) == 0) {
        pcVar1 = *in;
        *in = pcVar1 + 1;
        in_local._4_4_ = (int)*pcVar1;
      }
      else {
        *value = 0;
        while( true ) {
          ppuVar5 = __ctype_b_loc();
          puVar2 = *ppuVar5;
          pbVar3 = (byte *)*in;
          *in = (char *)(pbVar3 + 1);
          buff[0x3f] = *pbVar3;
          if ((puVar2[(int)(uint)(byte)buff[0x3f]] & 0x800) == 0) break;
          *value = *value * 10 + (long)buff[0x3f] + -0x30;
        }
        *in = *in + -1;
        in_local._4_4_ = 0x10b;
      }
      return in_local._4_4_;
    }
    local_90 = pLStack_80->abbrev;
    if (local_90 == 0) {
      local_90 = strlen(pLStack_80->name);
    }
    sVar6 = strlen(local_68);
    if (local_90 <= sVar6) {
      pcVar1 = pLStack_80->name;
      sVar6 = strlen(local_68);
      iVar4 = strncmp(pcVar1,local_68,sVar6);
      if (iVar4 == 0) {
        *in = (char *)tp;
        *value = pLStack_80->value;
        return pLStack_80->type;
      }
    }
    pLStack_80 = pLStack_80 + 1;
  } while( true );
}

Assistant:

static int
nexttoken(const char **in, time_t *value)
{
	char	c;
	char	buff[64];

	for ( ; ; ) {
		while (isspace((unsigned char)**in))
			++*in;

		/* Skip parenthesized comments. */
		if (**in == '(') {
			int Count = 0;
			do {
				c = *(*in)++;
				if (c == '\0')
					return c;
				if (c == '(')
					Count++;
				else if (c == ')')
					Count--;
			} while (Count > 0);
			continue;
		}

		/* Try the next token in the word table first. */
		/* This allows us to match "2nd", for example. */
		{
			const char *src = *in;
			const struct LEXICON *tp;
			unsigned i = 0;

			/* Force to lowercase and strip '.' characters. */
			while (*src != '\0'
			    && (isalnum((unsigned char)*src) || *src == '.')
			    && i < sizeof(buff)-1) {
				if (*src != '.') {
					if (isupper((unsigned char)*src))
						buff[i++] = tolower((unsigned char)*src);
					else
						buff[i++] = *src;
				}
				src++;
			}
			buff[i] = '\0';

			/*
			 * Find the first match.  If the word can be
			 * abbreviated, make sure we match at least
			 * the minimum abbreviation.
			 */
			for (tp = TimeWords; tp->name; tp++) {
				size_t abbrev = tp->abbrev;
				if (abbrev == 0)
					abbrev = strlen(tp->name);
				if (strlen(buff) >= abbrev
				    && strncmp(tp->name, buff, strlen(buff))
				    	== 0) {
					/* Skip over token. */
					*in = src;
					/* Return the match. */
					*value = tp->value;
					return tp->type;
				}
			}
		}

		/*
		 * Not in the word table, maybe it's a number.  Note:
		 * Because '-' and '+' have other special meanings, I
		 * don't deal with signed numbers here.
		 */
		if (isdigit((unsigned char)(c = **in))) {
			for (*value = 0; isdigit((unsigned char)(c = *(*in)++)); )
				*value = 10 * *value + c - '0';
			(*in)--;
			return (tUNUMBER);
		}

		return *(*in)++;
	}
}